

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.h
# Opt level: O0

void __thiscall ast::Statement_empty::~Statement_empty(Statement_empty *this)

{
  Statement_empty *this_local;
  
  ~Statement_empty(this);
  operator_delete(this);
  return;
}

Assistant:

Statement_empty(string *l, Location left):
		Statement {left} {
		section_index = Sections::current_section->number;
		section_offset = Sections::current_section->content_size;
		add_label(l);
	 }